

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::sendError(Connection *this,Exception *exception)

{
  PromiseArenaMember *pPVar1;
  undefined8 *in_RDX;
  ArrayDisposer **ppAVar2;
  Promise<void> promise;
  PromiseArenaMember *local_1d8;
  PromiseArenaMember *local_1d0;
  Exception *local_1c8;
  Exception local_1c0;
  
  *(undefined1 *)((long)exception->trace + 0xfc) = 1;
  ppAVar2 = &(exception->ownFile).content.disposer;
  if (*(ArrayDisposer ***)(exception->file + 0x50) != (ArrayDisposer **)0x0) {
    ppAVar2 = *(ArrayDisposer ***)(exception->file + 0x50);
  }
  local_1c0.ownFile.content.ptr = (char *)*in_RDX;
  local_1c0.ownFile.content.size_ = in_RDX[1];
  local_1c0.ownFile.content.disposer = (ArrayDisposer *)in_RDX[2];
  *in_RDX = 0;
  in_RDX[1] = 0;
  local_1c0.file = (char *)in_RDX[3];
  local_1c0._32_8_ = in_RDX[4];
  local_1c0.description.content.ptr = (char *)in_RDX[5];
  local_1c0.description.content.size_ = in_RDX[6];
  in_RDX[5] = 0;
  in_RDX[6] = 0;
  local_1c0.description.content.disposer = (ArrayDisposer *)in_RDX[7];
  local_1c0.context.ptr.disposer = (Disposer *)in_RDX[8];
  local_1c0.context.ptr.ptr = (Context *)in_RDX[9];
  local_1c0.remoteTrace.content.ptr = (char *)in_RDX[10];
  in_RDX[9] = 0;
  local_1c0.remoteTrace.content.size_ = in_RDX[0xb];
  local_1c0.remoteTrace.content.disposer = (ArrayDisposer *)in_RDX[0xc];
  in_RDX[10] = 0;
  in_RDX[0xb] = 0;
  memcpy(local_1c0.trace,in_RDX + 0xd,0x105);
  local_1c0.details.builder.ptr = (Detail *)in_RDX[0x2e];
  local_1c0.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)in_RDX[0x2f];
  local_1c0.details.builder.endPtr = (Detail *)in_RDX[0x30];
  local_1c0.details.builder.disposer = (ArrayDisposer *)in_RDX[0x31];
  in_RDX[0x30] = 0;
  in_RDX[0x2e] = 0;
  in_RDX[0x2f] = 0;
  local_1c8 = (Exception *)0x0;
  if (*(char *)(exception->trace + 0x1c) != '\0') {
    local_1c8 = exception;
  }
  (*(code *)(*ppAVar2)[1]._vptr_ArrayDisposer)(&local_1d8,ppAVar2,&local_1c0);
  Exception::~Exception(&local_1c0);
  local_1d0 = local_1d8;
  local_1d8 = (PromiseArenaMember *)0x0;
  finishSendingError(this,(Promise<void> *)exception);
  pPVar1 = local_1d0;
  if (local_1d0 != (PromiseArenaMember *)0x0) {
    local_1d0 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(pPVar1);
  }
  pPVar1 = local_1d8;
  if (local_1d8 != (PromiseArenaMember *)0x0) {
    local_1d8 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(pPVar1);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> sendError(kj::Exception&& exception) {
    closeAfterSend = true;

    // We only provide the Response object if we know we haven't already sent a response.
    auto promise = server.settings.errorHandler.orDefault(*this).handleApplicationError(
        kj::mv(exception), currentMethod.map([this](auto&&) -> Response& { return *this; }));
    return finishSendingError(kj::mv(promise));
  }